

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::walkFunctionInModule
          (Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_> *this,Function *func,
          Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  doWalkFunction(this,func);
  wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer::
  visitFunction(wasm::Function__(this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }